

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (Scope *scope,ModportSubroutinePortSyntax *syntax,bool isExport)

{
  Token nameToken;
  int iVar1;
  SubroutineSymbol **ppSVar2;
  DeclaredType *pDVar3;
  DataTypeSyntax *newType;
  Type *newType_00;
  undefined4 extraout_var;
  byte in_DL;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  undefined7 in_stack_00000028;
  bool in_stack_0000002f;
  undefined4 in_stack_00000030;
  VariableLifetime in_stack_00000034;
  FunctionPortListSyntax *in_stack_00000038;
  Scope *in_stack_00000040;
  Scope *in_stack_00000048;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  SubroutineSymbol *target;
  MethodPrototypeSymbol *result;
  FunctionPrototypeSyntax *proto;
  Compilation *comp;
  optional<const_slang::ast::SubroutineSymbol_*> *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff10;
  bitmask<slang::ast::MethodFlags> in_stack_ffffffffffffff16;
  pointer local_b8;
  size_t local_b0;
  bitmask<slang::ast::MethodFlags> local_92;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_90 [2];
  SubroutineSymbol *local_50;
  Token local_48;
  MethodPrototypeSymbol *local_38;
  FunctionPrototypeSyntax *local_30;
  Compilation *local_28;
  byte local_19;
  SyntaxNode *local_18;
  MethodPrototypeSymbol *local_8;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_28 = Scope::getCompilation(in_RDI);
  local_30 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
                       ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x7e4628);
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator->
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x7e465b);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x7e4667);
  local_48 = slang::syntax::SyntaxNode::getLastToken(local_18);
  nameToken.info = (Info *)in_stack_00000048;
  nameToken._0_8_ = in_stack_00000040;
  local_38 = createForModport((Scope *)in_stack_00000038,
                              (SyntaxNode *)CONCAT44(in_stack_00000034,in_stack_00000030),nameToken,
                              in_stack_0000002f);
  ppSVar2 = std::optional<const_slang::ast::SubroutineSymbol_*>::value(in_stack_ffffffffffffff00);
  local_50 = *ppSVar2;
  if (local_50 == (SubroutineSymbol *)0x0) {
    local_8 = local_38;
  }
  else {
    local_38->subroutineKind = (uint)((local_30->keyword).kind == TaskKeyword);
    if (local_38->subroutineKind == Function) {
      pDVar3 = &local_38->declaredReturnType;
      newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                          ((not_null<slang::syntax::DataTypeSyntax_*> *)0x7e474e);
      DeclaredType::setTypeSyntax(pDVar3,newType);
    }
    else {
      pDVar3 = &local_38->declaredReturnType;
      newType_00 = Compilation::getVoidType(local_28);
      DeclaredType::setType(pDVar3,newType_00);
    }
    SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x7e4792);
    src = extraout_RDX;
    if (local_30->portList != (FunctionPortListSyntax *)0x0) {
      in_stack_ffffffffffffff16 =
           SubroutineSymbol::buildArguments
                     (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034,
                      (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                      CONCAT17(in_stack_0000002f,in_stack_00000028));
      local_92 = in_stack_ffffffffffffff16;
      bitmask<slang::ast::MethodFlags>::operator|=(&local_38->flags,&local_92);
      src = extraout_RDX_00;
    }
    iVar1 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_90,(EVP_PKEY_CTX *)local_28,src);
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
    span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
              ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
               CONCAT26(in_stack_ffffffffffffff16.m_bits,in_stack_ffffffffffffff10),
               (span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *)
               CONCAT44(extraout_var,iVar1));
    (local_38->arguments)._M_ptr = local_b8;
    (local_38->arguments)._M_extent._M_extent_value = local_b0;
    local_38->needsMatchCheck = true;
    local_8 = local_38;
    SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x7e48a6);
  }
  return local_8;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const Scope& scope,
                                                         const ModportSubroutinePortSyntax& syntax,
                                                         bool isExport) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto& result = createForModport(scope, syntax, syntax.prototype->name->getLastToken(),
                                    isExport);

    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                         : SubroutineKind::Function;

    if (result.subroutineKind == SubroutineKind::Function)
        result.declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result.declaredReturnType.setType(comp.getVoidType());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result.flags |= SubroutineSymbol::buildArguments(result, scope, *proto.portList,
                                                         VariableLifetime::Automatic, arguments);
    }

    result.arguments = arguments.copy(comp);
    result.needsMatchCheck = true;
    return result;
}